

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O1

UString * jsonnet::internal::jsonnet_string_unparse
                    (UString *__return_storage_ptr__,UString *str,bool single)

{
  undefined7 in_register_00000011;
  char32_t __c;
  UStringStream ss;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_68;
  UString local_48;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = L'\0';
  __c = (int)CONCAT71(in_register_00000011,single) * 5 + L'\"';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_68,__c);
  jsonnet_string_escape(&local_48,str,single);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  _M_append(&local_68,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
  }
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&local_68,__c);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::u32string::_M_construct<char32_t*>
            ((u32string *)__return_storage_ptr__,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT44(local_68.field_2._M_local_buf[1],local_68.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

UString jsonnet_string_unparse(const UString &str, bool single)
{
    UStringStream ss;
    ss << (single ? U'\'' : U'\"');
    ss << jsonnet_string_escape(str, single);
    ss << (single ? U'\'' : U'\"');
    return ss.str();
}